

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O0

void __thiscall
SuiteTimeRangeTests::TestisInSameRangeWithDay::RunImpl(TestisInSameRangeWithDay *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_bb8;
  UtcTimeStamp local_b98;
  UtcTimeStamp local_b80;
  UtcTimeOnly local_b68;
  UtcTimeOnly local_b50 [2];
  TestDetails local_b18;
  UtcTimeStamp local_af8;
  UtcTimeStamp local_ae0;
  UtcTimeOnly local_ac8;
  UtcTimeOnly local_ab0 [2];
  TestDetails local_a78;
  UtcTimeStamp local_a58 [2];
  TestDetails local_a20;
  UtcTimeStamp local_a00 [2];
  TestDetails local_9c8;
  UtcTimeStamp local_9a8;
  UtcTimeStamp local_990;
  UtcTimeOnly local_978;
  UtcTimeOnly local_960 [2];
  TestDetails local_928;
  UtcTimeStamp local_908 [2];
  TestDetails local_8d0;
  UtcTimeStamp local_8b0 [2];
  TestDetails local_878;
  UtcTimeStamp local_858;
  UtcTimeStamp local_840 [2];
  TestDetails local_808;
  UtcTimeStamp local_7e8 [2];
  TestDetails local_7b0;
  UtcTimeStamp local_790 [2];
  TestDetails local_758;
  UtcTimeStamp local_738;
  UtcTimeStamp local_720;
  UtcTimeOnly local_708;
  UtcTimeOnly local_6f0 [2];
  TestDetails local_6b8;
  UtcTimeStamp local_698;
  UtcTimeStamp local_680;
  UtcTimeOnly local_668;
  UtcTimeOnly local_650 [2];
  TestDetails local_618;
  UtcTimeStamp local_5f8;
  UtcTimeStamp local_5e0;
  UtcTimeOnly local_5c8;
  UtcTimeOnly local_5b0 [2];
  TestDetails local_578 [2];
  TestDetails local_538;
  UtcTimeStamp local_518;
  UtcTimeStamp local_500 [2];
  TestDetails local_4c8;
  UtcTimeStamp local_4a8;
  UtcTimeStamp local_490 [2];
  TestDetails local_458;
  UtcTimeStamp local_438;
  UtcTimeStamp local_420;
  UtcTimeOnly local_408;
  UtcTimeOnly local_3f0 [2];
  TestDetails local_3b8;
  UtcTimeStamp local_398;
  UtcTimeStamp local_380 [2];
  TestDetails local_348;
  UtcTimeStamp local_328;
  UtcTimeStamp local_310 [2];
  TestDetails local_2d8;
  UtcTimeStamp local_2b8;
  UtcTimeStamp local_2a0 [2];
  TestDetails local_268;
  UtcTimeStamp local_248;
  UtcTimeStamp local_230 [2];
  TestDetails local_1f8;
  UtcTimeStamp local_1d8;
  UtcTimeStamp local_1c0 [2];
  TestDetails local_188;
  UtcTimeStamp local_168;
  UtcTimeStamp local_150 [2];
  TestDetails local_118;
  UtcTimeStamp local_f8;
  UtcTimeStamp local_e0 [2];
  TestDetails local_a8;
  undefined1 local_88 [8];
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  int endDay;
  int startDay;
  undefined1 local_40 [8];
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  TestisInSameRangeWithDay *this_local;
  
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)local_40,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_88,3,0,0,0x19,7,0x7d4);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a8,*ppTVar4,0x112);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_a8,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_e0,3,0,0,0x1f,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_e0);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_e0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_f8,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_f8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_f8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_118,*ppTVar4,0x117);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_118,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_150,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_150);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_150);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_168,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_168);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_168);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_188,*ppTVar4,0x11c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_188,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_1c0,10,0,0,0x1a,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_1c0);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_1c0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_1d8,3,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_1d8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_1d8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_1f8,*ppTVar4,0x121);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_1f8,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_230,10,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_230);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_230);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_248,2,0,0,0x1d,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_248);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_248);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_268,*ppTVar4,0x126);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_268,
               "TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_2a0,10,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_2a0);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_2a0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_2b8,3,0,0,0x14,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_2b8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_2b8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_2d8,*ppTVar4,299);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_2d8,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_310,2,0,0,0x1b,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_310);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_310);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_328,3,0,0,0x14,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_328);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_328);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_348,*ppTVar4,0x130);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_348,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_380,2,0,0,0x1a,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_380);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_380);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_398,3,0,0,0x13,7,0x7d4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_398);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_398);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_3b8,*ppTVar4,0x135);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_3b8,
               "!TimeRange::isInSameRange ( startTime, endTime, startDay, endDay, time1, time2 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_3f0,0,5,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_3f0);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_3f0);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_408,0x17,0x2d,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_408);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_408);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_420,0,0,0,4,4,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_420);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_420);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_438,1,0,0,3,4,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_438);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_438);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,7,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_458,*ppTVar4,0x142);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_458,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_490,0,0,0,0x1e,10,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_490);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_490);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_4a8,1,0,0,0x1f,10,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_4a8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_4a8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,7,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_4c8,*ppTVar4,0x147);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_4c8,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_500,10,10,10,0x1f,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_500);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_500);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_518,10,10,10,1,1,0x7d7);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_518);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_518);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,7,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_538,*ppTVar4,0x14c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_538,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,-1,-1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_578,*ppTVar4,0x151);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_578,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_5b0,0x16,0x1c,0x14,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_5b0);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_5b0);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_5c8,0x16,0x1c,5,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_5c8);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_5c8);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_5e0,0x16,0x1c,2,0x10,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_5e0);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_5e0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_5f8,0x16,0x1e,0x2f,0x10,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_5f8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_5f8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,5,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_618,*ppTVar4,0x159);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_618,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_650,0x16,0x18,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_650);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_650);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_668,0x16,0xf,0x1e,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_668);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_668);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_680,0x12,0xf,0xf,0xf,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_680);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_680);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_698,0x16,0x1a,0x14,0x10,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_698);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_698);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,5,5,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_6b8,*ppTVar4,0x15f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_6b8,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_6f0,9,1,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_6f0);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_6f0);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_708,8,0x3b,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_708);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_708);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_720,9,1,0,3,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_720);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_720);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_738,9,1,0,3,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_738);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_738);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_758,*ppTVar4,0x168);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_758,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_790,9,1,0,10,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_790);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_790);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_7b0,*ppTVar4,0x16a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_7b0,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_7e8,9,1,0,4,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_7e8);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_7e8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_808,*ppTVar4,0x16c);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_808,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_840,10,1,0,3,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,local_840);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_840);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_858,9,1,0,10,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_858);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_858);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_878,*ppTVar4,0x170);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_878,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_8b0,8,1,0,10,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_8b0);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_8b0);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar4,0x172);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_8d0,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_908,8,1,0,5,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_908);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_908);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,1,1,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_928,*ppTVar4,0x174);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_928,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_960,9,1,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_960);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_960);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_978,8,0x3b,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_978);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_978);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_990,9,1,0,3,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_990);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_990);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_9a8,9,1,0,5,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_9a8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_9a8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,2,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_9c8,*ppTVar4,0x17d);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_9c8,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_a00,9,1,0,0xb,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_a00);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_a00);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,2,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>((bool)(~bVar2 & 1));
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a20,*ppTVar4,0x17f);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_a20,
               "!TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::UtcTimeStamp(local_a58,8,1,0,3,0xc,0x7d6);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,local_a58);
  FIX::UtcTimeStamp::~UtcTimeStamp(local_a58);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,2,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_a78,*ppTVar4,0x181);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_a78,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_ab0,0x11,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_ab0);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_ab0);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_ac8,0x10,2,0x1e,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_ac8);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_ac8);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_ae0,0x17,4,3,0x11,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_ae0);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_ae0);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_af8,6,0,0,0x13,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_af8);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_af8);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,2,2,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b18,*ppTVar4,0x18a);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b18,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeOnly::UtcTimeOnly(local_b50,0x11,0,0,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)&endTime.super_DateTime.m_time,local_b50);
  FIX::UtcTimeOnly::~UtcTimeOnly(local_b50);
  FIX::UtcTimeOnly::UtcTimeOnly(&local_b68,0x10,2,0x1e,0);
  FIX::UtcTimeOnly::operator=((UtcTimeOnly *)local_40,&local_b68);
  FIX::UtcTimeOnly::~UtcTimeOnly(&local_b68);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_b80,0x17,4,3,0x11,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)&time2.super_DateTime.m_time,&local_b80);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_b80);
  FIX::UtcTimeStamp::UtcTimeStamp(&local_b98,6,0,0,0x14,1,0x7e4);
  FIX::UtcTimeStamp::operator=((UtcTimeStamp *)local_88,&local_b98);
  FIX::UtcTimeStamp::~UtcTimeStamp(&local_b98);
  bVar2 = FIX::TimeRange::isInSameRange
                    ((UtcTimeOnly *)&endTime.super_DateTime.m_time,(UtcTimeOnly *)local_40,4,4,
                     (DateTime *)&time2.super_DateTime.m_time,(DateTime *)local_88);
  bVar2 = UnitTest::Check<bool>(bVar2);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_bb8,*ppTVar4,0x192);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_bb8,
               "TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2)");
  }
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_88);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_40);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)&endTime.super_DateTime.m_time);
  return;
}

Assistant:

TEST(isInSameRangeWithDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 5;

  UtcTimeStamp time1( 3, 0, 0, 27, 7, 2004 );
  UtcTimeStamp time2( 3, 0, 0, 25, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 31, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 27, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 2, 0, 0, 29, 7, 2004 );
  CHECK( TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 10, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 27, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 20, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  time1 = UtcTimeStamp( 2, 0, 0, 26, 7, 2004 );
  time2 = UtcTimeStamp( 3, 0, 0, 19, 7, 2004 );
  CHECK( !TimeRange::isInSameRange
    ( startTime, endTime, startDay, endDay, time1, time2 ) );

  // Reset start/end time so that they fall within an hour of midnight
  startTime = UtcTimeOnly(0, 5, 0);
  endTime = UtcTimeOnly(23, 45, 0);

  // Make it a week-long session
  startDay = 1;
  endDay = 7;

  // Check that ST-->DST (Sunday is missing one hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 4, 4, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 3, 4, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that DST-->ST (Sunday has an extra hour) is handled
  time1 = UtcTimeStamp(0, 0, 0, 30, 10, 2006);
  time2 = UtcTimeStamp(1, 0, 0, 31, 10, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that everything works across a year boundary
  time1 = UtcTimeStamp(10, 10, 10, 31, 12, 2006);
  time2 = UtcTimeStamp(10, 10, 10, 1, 1, 2007);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Check that "missing" start and end days are handled as isSameSession without days
  startDay = -1;
  endDay = -1;
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 5;
  endDay = 5;
  startTime = UtcTimeOnly(22, 28, 20);
  endTime = UtcTimeOnly(22, 28, 5);
  time1 = UtcTimeStamp(22, 28, 2, 16, 1, 2020); // session
  time2 = UtcTimeStamp(22, 30, 47, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startTime = UtcTimeOnly(22, 24, 0);
  endTime = UtcTimeOnly(22, 15, 30);
  time1 = UtcTimeStamp(18, 15, 15, 15, 1, 2020); // session
  time2 = UtcTimeStamp(22, 26, 20, 16, 1, 2020); // date
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same
  startDay = 1;
  endDay = 1;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 4, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  time1 = UtcTimeStamp(10, 1, 0, 3, 12, 2006);
  time2 = UtcTimeStamp(9, 1, 0, 10, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 10, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 5, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Session days are the same, and not today
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(9, 1, 0);
  endTime = UtcTimeOnly(8, 59, 0);
  time1 = UtcTimeStamp(9, 1, 0, 3, 12, 2006); // day before swap
  time2 = UtcTimeStamp(9, 1, 0, 5, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(9, 1, 0, 11, 12, 2006);
  CHECK( !TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
  time2 = UtcTimeStamp(8, 1, 0, 3, 12, 2006);
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  // Re-creating weekend cert reset
  startDay = 2;
  endDay = 2;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 19, 1, 2020); // 20200119-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );

  startDay = 4;
  endDay = 4;
  startTime = UtcTimeOnly(17, 0, 0);
  endTime = UtcTimeOnly(16, 02, 30);
  time1 = UtcTimeStamp(23, 4, 3, 17, 1, 2020); // 20200117-23:04:03.008 -> H M S, D M Y
  time2 = UtcTimeStamp(6, 0, 0, 20, 1, 2020); // 20200120-06:00:00
  CHECK( TimeRange::isInSameRange(startTime, endTime, startDay, endDay, time1, time2) );
}